

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# difference_iterator.hpp
# Opt level: O0

difference_iterator<std::_Fwd_list_const_iterator<int>,_std::_Fwd_list_const_iterator<int>,_std::less<void>_>
* __thiscall
burst::
make_difference_iterator<std::_Fwd_list_const_iterator<int>,std::_Fwd_list_const_iterator<int>>
          (difference_iterator<std::_Fwd_list_const_iterator<int>,_std::_Fwd_list_const_iterator<int>,_std::less<void>_>
           *__return_storage_ptr__,burst *this,_Fwd_list_const_iterator<int> minuend_begin,
          _Fwd_list_const_iterator<int> minuend_end,_Fwd_list_const_iterator<int> subtrahend_begin,
          _Fwd_list_const_iterator<int> subtrahend_end)

{
  _Fwd_list_const_iterator<int> subtrahend_end_local;
  _Fwd_list_const_iterator<int> subtrahend_begin_local;
  _Fwd_list_const_iterator<int> minuend_end_local;
  _Fwd_list_const_iterator<int> minuend_begin_local;
  
  difference_iterator<std::_Fwd_list_const_iterator<int>,_std::_Fwd_list_const_iterator<int>,_std::less<void>_>
  ::difference_iterator
            (__return_storage_ptr__,this,minuend_begin._M_node,minuend_end._M_node,
             subtrahend_begin._M_node);
  return __return_storage_ptr__;
}

Assistant:

auto
        make_difference_iterator
        (
            ForwardIterator1 minuend_begin, ForwardIterator1 minuend_end,
            ForwardIterator2 subtrahend_begin, ForwardIterator2 subtrahend_end
        )
    {
        return
            difference_iterator<ForwardIterator1, ForwardIterator2>
            (
                std::move(minuend_begin),
                std::move(minuend_end),
                std::move(subtrahend_begin),
                std::move(subtrahend_end)
            );
    }